

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directize.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_157::FunctionDirectizer::create(FunctionDirectizer *this)

{
  FunctionDirectizer *this_local;
  
  this_local = this;
  std::
  make_unique<wasm::(anonymous_namespace)::FunctionDirectizer,std::unordered_map<wasm::Name,wasm::(anonymous_namespace)::TableInfo,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::(anonymous_namespace)::TableInfo>>>const&>
            ((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
              *)&stack0xffffffffffffffe0);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::(anonymous_namespace)::FunctionDirectizer,std::default_delete<wasm::(anonymous_namespace)::FunctionDirectizer>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<wasm::(anonymous_namespace)::FunctionDirectizer,_std::default_delete<wasm::(anonymous_namespace)::FunctionDirectizer>_>
              *)&stack0xffffffffffffffe0);
  std::
  unique_ptr<wasm::(anonymous_namespace)::FunctionDirectizer,_std::default_delete<wasm::(anonymous_namespace)::FunctionDirectizer>_>
  ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::FunctionDirectizer,_std::default_delete<wasm::(anonymous_namespace)::FunctionDirectizer>_>
                 *)&stack0xffffffffffffffe0);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<FunctionDirectizer>(tables);
  }